

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O1

void dlib::cpu::multiply_conv(bool add_to,tensor *dest,tensor *src1,tensor *src2)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar8;
  fatal_error *pfVar9;
  void *__s;
  long lVar10;
  long k;
  long lVar11;
  long r;
  long lVar12;
  long lVar13;
  long c;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [64];
  ostringstream dlib_o_out;
  string local_1c8;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  iVar7 = (*dest->_vptr_tensor[3])(dest);
  __s = (void *)CONCAT44(extraout_var,iVar7);
  iVar7 = (*src1->_vptr_tensor[2])(src1);
  lVar15 = CONCAT44(extraout_var_00,iVar7);
  iVar7 = (*src2->_vptr_tensor[2])();
  lVar16 = CONCAT44(extraout_var_01,iVar7);
  lVar2 = dest->m_n;
  lVar3 = src1->m_n;
  if ((((lVar2 == lVar3) && (dest->m_k == src1->m_k)) && (dest->m_nr == src1->m_nr)) &&
     (dest->m_nc == src1->m_nc)) {
    if ((((src2->m_n != 1) || (src2->m_nr != 1)) || (src2->m_nc != 1)) || (src2->m_k != src1->m_k))
    {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x5e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "void dlib::cpu::multiply_conv(bool, tensor &, const tensor &, const tensor &)",
                 0x4d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "src2.num_samples() == 1 && src2.nr() == 1 && src2.nc() == 1 && src2.k() == src1.k()"
                 ,0x53);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
      puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
      *puVar1 = *puVar1 | 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      pfVar9 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar9,EBROKEN_ASSERT,&local_1c8);
      __cxa_throw(pfVar9,&fatal_error::typeinfo,error::~error);
    }
    if (add_to) {
      if (0 < lVar2) {
        lVar3 = dest->m_k;
        lVar4 = dest->m_nr;
        lVar10 = 0;
        do {
          if (0 < lVar3) {
            lVar5 = dest->m_nc;
            lVar11 = 0;
            do {
              if (0 < lVar4) {
                lVar12 = 0;
                do {
                  if (0 < lVar5) {
                    lVar13 = 0;
                    lVar14 = 0;
                    do {
                      auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar16 + lVar11 * 4)),
                                               ZEXT416(*(uint *)(lVar15 + lVar14 * 4)),
                                               ZEXT416(*(uint *)((long)__s + lVar14 * 4)));
                      *(int *)((long)__s + lVar14 * 4) = auVar6._0_4_;
                      lVar14 = lVar14 + 1;
                      lVar13 = lVar13 + -4;
                    } while (lVar5 != lVar14);
                    lVar15 = lVar15 - lVar13;
                    __s = (void *)((long)__s - lVar13);
                  }
                  lVar12 = lVar12 + 1;
                } while (lVar12 != lVar4);
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 != lVar3);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar2);
      }
    }
    else if (0 < lVar2) {
      lVar3 = dest->m_k;
      lVar4 = dest->m_nr;
      lVar10 = 0;
      do {
        if (0 < lVar3) {
          lVar5 = dest->m_nc;
          lVar11 = 0;
          do {
            if (0 < lVar4) {
              lVar12 = 0;
              do {
                if (0 < lVar5) {
                  lVar13 = 0;
                  lVar14 = 0;
                  do {
                    *(float *)((long)__s + lVar14 * 4) =
                         *(float *)(lVar15 + lVar14 * 4) * *(float *)(lVar16 + lVar11 * 4);
                    lVar14 = lVar14 + 1;
                    lVar13 = lVar13 + -4;
                  } while (lVar5 != lVar14);
                  lVar15 = lVar15 - lVar13;
                  __s = (void *)((long)__s - lVar13);
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 != lVar4);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != lVar3);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar2);
    }
  }
  else {
    if (((lVar3 != src2->m_n) || (src1->m_k != src2->m_k)) ||
       ((src1->m_nr != src2->m_nr || (src1->m_nc != src2->m_nc)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x83);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "void dlib::cpu::multiply_conv(bool, tensor &, const tensor &, const tensor &)",
                 0x4d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"have_same_dimensions(src1,src2)",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
      puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
      *puVar1 = *puVar1 | 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      pfVar9 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar9,EBROKEN_ASSERT,&local_1c8);
      __cxa_throw(pfVar9,&fatal_error::typeinfo,error::~error);
    }
    if (((lVar2 != 1) || (dest->m_nr != 1)) ||
       ((dest->m_nc != 1 || (lVar2 = src1->m_k, dest->m_k != lVar2)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x84);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "void dlib::cpu::multiply_conv(bool, tensor &, const tensor &, const tensor &)",
                 0x4d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "dest.num_samples() == 1 && dest.nr() == 1 && dest.nc() == 1 && dest.k() == src1.k()"
                 ,0x53);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
      puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
      *puVar1 = *puVar1 | 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      pfVar9 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar9,EBROKEN_ASSERT,&local_1c8);
      __cxa_throw(pfVar9,&fatal_error::typeinfo,error::~error);
    }
    if (0 < lVar2 && !add_to) {
      memset(__s,0,lVar2 * 4);
    }
    if (0 < lVar3) {
      lVar4 = src1->m_nr;
      lVar10 = 0;
      do {
        if (0 < lVar2) {
          lVar5 = src1->m_nc;
          lVar11 = 0;
          do {
            if (0 < lVar4) {
              lVar12 = 0;
              do {
                if (0 < lVar5) {
                  auVar17 = ZEXT464(*(uint *)((long)__s + lVar11 * 4));
                  lVar13 = 0;
                  lVar14 = 0;
                  do {
                    auVar6 = vfmadd231ss_fma(auVar17._0_16_,ZEXT416(*(uint *)(lVar15 + lVar14 * 4)),
                                             ZEXT416(*(uint *)(lVar16 + lVar14 * 4)));
                    auVar17 = ZEXT1664(auVar6);
                    *(int *)((long)__s + lVar11 * 4) = auVar6._0_4_;
                    lVar14 = lVar14 + 1;
                    lVar13 = lVar13 + -4;
                  } while (lVar5 != lVar14);
                  lVar16 = lVar16 - lVar13;
                  lVar15 = lVar15 - lVar13;
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 != lVar4);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != lVar2);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar3);
    }
  }
  return;
}

Assistant:

void multiply_conv (
            bool add_to,
            tensor& dest,
            const tensor& src1,
            const tensor& src2
        )
        {
            auto d = dest.host();
            auto s1 = src1.host();
            auto s2 = src2.host();
            if (have_same_dimensions(dest,src1))
            {
                DLIB_CASSERT(src2.num_samples() == 1 && src2.nr() == 1 && src2.nc() == 1 && src2.k() == src1.k());

                if (add_to)
                {
                    for (long n = 0; n < dest.num_samples(); ++n)
                    {
                        for (long k = 0; k < dest.k(); ++k)
                        {
                            for (long r = 0; r < dest.nr(); ++r)
                            {
                                for (long c = 0; c < dest.nc(); ++c)
                                {
                                    *d++ += (*s1++)*s2[k];
                                }
                            }
                        }
                    }
                }
                else
                {
                    for (long n = 0; n < dest.num_samples(); ++n)
                    {
                        for (long k = 0; k < dest.k(); ++k)
                        {
                            for (long r = 0; r < dest.nr(); ++r)
                            {
                                for (long c = 0; c < dest.nc(); ++c)
                                {
                                    *d++ = (*s1++)*s2[k];
                                }
                            }
                        }
                    }
                }
            }
            else
            {
                DLIB_CASSERT(have_same_dimensions(src1,src2));
                DLIB_CASSERT(dest.num_samples() == 1 && dest.nr() == 1 && dest.nc() == 1 && dest.k() == src1.k());

                if (!add_to)
                {
                    for (long k = 0; k < src1.k(); ++k)
                        d[k] = 0;
                }

                for (long n = 0; n < src1.num_samples(); ++n)
                {
                    for (long k = 0; k < src1.k(); ++k)
                    {
                        for (long r = 0; r < src1.nr(); ++r)
                        {
                            for (long c = 0; c < src1.nc(); ++c)
                            {
                                d[k] += (*s1++)*(*s2++);
                            }
                        }
                    }
                }
            }
        }